

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O1

vector<glu::DataType,_std::allocator<glu::DataType>_> * __thiscall
deqp::gles2::Functional::anon_unknown_1::UniformCollection::getSamplerTypes
          (vector<glu::DataType,_std::allocator<glu::DataType>_> *__return_storage_ptr__,
          UniformCollection *this)

{
  pointer pUVar1;
  long lVar2;
  long lVar3;
  
  (__return_storage_ptr__->super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pUVar1 = (this->m_uniforms).
           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_uniforms).
                              super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 3) *
          -0x49249249) {
    lVar3 = 0x20;
    lVar2 = 0;
    do {
      getDistinctSamplerTypes
                (__return_storage_ptr__,(VarType *)((long)&(pUVar1->name)._M_dataplus + lVar3));
      lVar2 = lVar2 + 1;
      pUVar1 = (this->m_uniforms).
               super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x38;
    } while (lVar2 < (int)((ulong)((long)(this->m_uniforms).
                                         super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1)
                          >> 3) * -0x49249249);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<glu::DataType> getSamplerTypes (void) const
	{
		vector<glu::DataType> samplerTypes;
		for (int i = 0; i < (int)m_uniforms.size(); i++)
			getDistinctSamplerTypes(samplerTypes, m_uniforms[i].type);
		return samplerTypes;
	}